

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrs.cpp
# Opt level: O3

void __thiscall despot::FVRS::FVRS(FVRS *this,string *map)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (map->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + map->_M_string_length);
  BaseRockSample::BaseRockSample(&this->super_BaseRockSample,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_BaseRockSample = &PTR__BaseRockSample_0011aa48;
  *(undefined ***)&(this->super_BaseRockSample).super_BeliefMDP = &PTR__FVRS_0011ab60;
  *(undefined ***)&(this->super_BaseRockSample).super_StateIndexer = &PTR__FVRS_0011ac68;
  *(undefined ***)&(this->super_BaseRockSample).super_StatePolicy = &PTR__FVRS_0011aca0;
  (this->super_BaseRockSample).half_efficiency_distance_ =
       (double)((this->super_BaseRockSample).size_ + -1) * 1.4142135623730951 * 0.25 * 0.5;
  return;
}

Assistant:

FVRS::FVRS(string map) :
	BaseRockSample(map) {
	half_efficiency_distance_ = (size_ - 1) * sqrt(2) / 4 / 2;
}